

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldst_helper.c
# Opt level: O3

void helper_check_align_sparc(CPUSPARCState *env,target_ulong_conflict addr,uint32_t align)

{
  uintptr_t unaff_retaddr;
  
  if ((align & addr) == 0) {
    return;
  }
  cpu_raise_exception_ra_sparc(env,7,unaff_retaddr);
}

Assistant:

static void do_check_align(CPUSPARCState *env, target_ulong addr,
                           uint32_t align, uintptr_t ra)
{
    if (addr & align) {
#ifdef DEBUG_UNALIGNED
        printf("Unaligned access to 0x" TARGET_FMT_lx " from 0x" TARGET_FMT_lx
               "\n", addr, env->pc);
#endif
        cpu_raise_exception_ra(env, TT_UNALIGNED, ra);
    }
}